

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_automaticIdsImportSource_Test::~Annotator_automaticIdsImportSource_Test
          (Annotator_automaticIdsImportSource_Test *this)

{
  Annotator_automaticIdsImportSource_Test *this_local;
  
  ~Annotator_automaticIdsImportSource_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Annotator, automaticIdsImportSource)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"everything\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-model.xml\">\n"
        "    <component component_ref=\"a_component_in_that_model\" name=\"component1\" />\n"
        "  </import>\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-model.xml\">\n"
        "    <units units_ref=\"a_units_in_that_model\" name=\"units1\"/>\n"
        "  </import>\n"
        "</model>";
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(in);
    auto annotator = libcellml::Annotator::create();

    annotator->setModel(model);

    EXPECT_EQ("", model->id());
    EXPECT_EQ("", model->component("component1")->importSource()->id());
    EXPECT_EQ("", model->units("units1")->importSource()->id());
    EXPECT_EQ("", model->units(0)->id());
    EXPECT_EQ("", model->component(0)->id());

    EXPECT_TRUE(annotator->assignIds(libcellml::CellmlElementType::IMPORT));
    EXPECT_TRUE(annotator->hasModel());

    EXPECT_EQ("", model->id());
    EXPECT_EQ("b4da55", model->component("component1")->importSource()->id());
    EXPECT_EQ("b4da56", model->units("units1")->importSource()->id());
    EXPECT_EQ("", model->units(0)->id());
    EXPECT_EQ("", model->component(0)->id());
}